

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall
leveldb::Version::LevelFileNumIterator::LevelFileNumIterator
          (LevelFileNumIterator *this,InternalKeyComparator *icmp,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *flist)

{
  size_type sVar1;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *in_RDX;
  Iterator *in_RDI;
  InternalKeyComparator *in_stack_ffffffffffffffd8;
  
  Iterator::Iterator(in_RDI);
  in_RDI->_vptr_Iterator = (_func_int **)&PTR__LevelFileNumIterator_00160430;
  InternalKeyComparator::InternalKeyComparator
            ((InternalKeyComparator *)in_RDI,in_stack_ffffffffffffffd8);
  in_RDI[1].cleanup_head_.arg1 = in_RDX;
  sVar1 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                    (in_RDX);
  *(int *)&in_RDI[1].cleanup_head_.arg2 = (int)sVar1;
  return;
}

Assistant:

LevelFileNumIterator(const InternalKeyComparator& icmp,
                       const std::vector<FileMetaData*>* flist)
      : icmp_(icmp), flist_(flist), index_(flist->size()) {  // Marks as invalid
  }